

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O3

void FTransformWHT_C(int16_t *in,int16_t *out)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int32_t tmp [16];
  
  lVar3 = 0;
  do {
    iVar1 = (int)in[lVar3 * 4 + 0x20] + (int)in[lVar3 * 4];
    iVar2 = (int)in[lVar3 * 4 + 0x30] + (int)in[lVar3 * 4 + 0x10];
    iVar5 = (int)in[lVar3 * 4 + 0x10] - (int)in[lVar3 * 4 + 0x30];
    iVar4 = (int)in[lVar3 * 4] - (int)in[lVar3 * 4 + 0x20];
    *(int *)((long)tmp + lVar3) = iVar2 + iVar1;
    *(int *)((long)tmp + lVar3 + 4) = iVar5 + iVar4;
    *(int *)((long)tmp + lVar3 + 8) = iVar4 - iVar5;
    *(int *)((long)tmp + lVar3 + 0xc) = iVar1 - iVar2;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  auVar6._0_4_ = tmp[4] - tmp[0xc];
  auVar6._4_4_ = tmp[5] - tmp[0xd];
  auVar6._8_4_ = tmp[6] - tmp[0xe];
  auVar6._12_4_ = tmp[7] - tmp[0xf];
  auVar8._0_4_ = (uint)(tmp[0xc] + tmp[4] + tmp[8] + tmp[0]) >> 1;
  auVar8._4_4_ = (uint)(tmp[0xd] + tmp[5] + tmp[9] + tmp[1]) >> 1;
  auVar8._8_4_ = (uint)(tmp[0xe] + tmp[6] + tmp[10] + tmp[2]) >> 1;
  auVar8._12_4_ = (uint)(tmp[0xf] + tmp[7] + tmp[0xb] + tmp[3]) >> 1;
  auVar7 = pshuflw(auVar6,auVar8,0xe8);
  auVar7 = pshufhw(auVar7,auVar7,0xe8);
  auVar10._0_4_ = (uint)(auVar6._0_4_ + (tmp[0] - tmp[8])) >> 1;
  auVar10._4_4_ = (uint)(auVar6._4_4_ + (tmp[1] - tmp[9])) >> 1;
  auVar10._8_4_ = (uint)(auVar6._8_4_ + (tmp[2] - tmp[10])) >> 1;
  auVar10._12_4_ = (uint)(auVar6._12_4_ + (tmp[3] - tmp[0xb])) >> 1;
  auVar9 = pshuflw(auVar8,auVar10,0xe8);
  auVar9 = pshufhw(auVar9,auVar9,0xe8);
  *(ulong *)out = CONCAT44(auVar7._8_4_,auVar7._0_4_);
  *(ulong *)(out + 4) = CONCAT44(auVar9._8_4_,auVar9._0_4_);
  auVar9._0_4_ = (uint)((tmp[0] - tmp[8]) - auVar6._0_4_) >> 1;
  auVar9._4_4_ = (uint)((tmp[1] - tmp[9]) - auVar6._4_4_) >> 1;
  auVar9._8_4_ = (uint)((tmp[2] - tmp[10]) - auVar6._8_4_) >> 1;
  auVar9._12_4_ = (uint)((tmp[3] - tmp[0xb]) - auVar6._12_4_) >> 1;
  auVar7 = pshuflw(auVar9,auVar9,0xe8);
  auVar9 = pshufhw(auVar7,auVar7,0xe8);
  auVar7._0_4_ = (uint)((tmp[8] + tmp[0]) - (tmp[0xc] + tmp[4])) >> 1;
  auVar7._4_4_ = (uint)((tmp[9] + tmp[1]) - (tmp[0xd] + tmp[5])) >> 1;
  auVar7._8_4_ = (uint)((tmp[10] + tmp[2]) - (tmp[0xe] + tmp[6])) >> 1;
  auVar7._12_4_ = (uint)((tmp[0xb] + tmp[3]) - (tmp[0xf] + tmp[7])) >> 1;
  auVar7 = pshuflw(auVar7,auVar7,0xe8);
  auVar7 = pshufhw(auVar7,auVar7,0xe8);
  *(ulong *)(out + 8) = CONCAT44(auVar9._8_4_,auVar9._0_4_);
  *(ulong *)(out + 0xc) = CONCAT44(auVar7._8_4_,auVar7._0_4_);
  return;
}

Assistant:

static void FTransformWHT_C(const int16_t* WEBP_RESTRICT in,
                            int16_t* WEBP_RESTRICT out) {
  // input is 12b signed
  int32_t tmp[16];
  int i;
  for (i = 0; i < 4; ++i, in += 64) {
    const int a0 = (in[0 * 16] + in[2 * 16]);  // 13b
    const int a1 = (in[1 * 16] + in[3 * 16]);
    const int a2 = (in[1 * 16] - in[3 * 16]);
    const int a3 = (in[0 * 16] - in[2 * 16]);
    tmp[0 + i * 4] = a0 + a1;   // 14b
    tmp[1 + i * 4] = a3 + a2;
    tmp[2 + i * 4] = a3 - a2;
    tmp[3 + i * 4] = a0 - a1;
  }
  for (i = 0; i < 4; ++i) {
    const int a0 = (tmp[0 + i] + tmp[8 + i]);  // 15b
    const int a1 = (tmp[4 + i] + tmp[12+ i]);
    const int a2 = (tmp[4 + i] - tmp[12+ i]);
    const int a3 = (tmp[0 + i] - tmp[8 + i]);
    const int b0 = a0 + a1;    // 16b
    const int b1 = a3 + a2;
    const int b2 = a3 - a2;
    const int b3 = a0 - a1;
    out[ 0 + i] = b0 >> 1;     // 15b
    out[ 4 + i] = b1 >> 1;
    out[ 8 + i] = b2 >> 1;
    out[12 + i] = b3 >> 1;
  }
}